

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O0

Matrix<Rational> __thiscall Matrix<Rational>::operator*(Matrix<Rational> *this,Matrix<Rational> *a)

{
  char *pcVar1;
  uint *puVar2;
  uint *in_RDX;
  uint *in_RSI;
  matrix_error *in_RDI;
  Matrix<Rational> MVar4;
  Matrix<Rational> *in_stack_00000070;
  Matrix<Rational> *in_stack_00000078;
  Matrix<Rational> *in_stack_000001a0;
  Matrix<Rational> *in_stack_000001a8;
  Rational *pRVar3;
  
  if (in_RSI[1] != *in_RDX) {
    pcVar1 = (char *)__cxa_allocate_exception(0x10);
    matrix_error::runtime_error(in_RDI,pcVar1);
    __cxa_throw(pcVar1,&matrix_error::typeinfo,matrix_error::~matrix_error);
  }
  puVar2 = std::max<unsigned_int>(in_RSI,in_RDX + 1);
  if (*puVar2 < 0x20) {
    MVar4 = _multiplyCube(in_stack_00000078,in_stack_00000070);
    pRVar3 = MVar4.arr;
  }
  else {
    MVar4 = _multiplyStrassen(in_stack_000001a8,in_stack_000001a0);
    pRVar3 = MVar4.arr;
  }
  MVar4.arr = pRVar3;
  MVar4._0_8_ = in_RDI;
  return MVar4;
}

Assistant:

const Matrix<Field> Matrix<Field>::operator*(const Matrix &a) const
{
    if(N != a.M)
        throw matrix_error("Trying to multiply matrices of different size");
    if(std::max(M, a.N) < strassen_threshold)
    {
        return _multiplyCube(a);
    }
    else
    {
        return _multiplyStrassen(a);
    }
}